

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O3

Vec_Ptr_t * Prs_ManReadBlif(char *pFileName)

{
  undefined1 *puVar1;
  char cVar2;
  size_t sVar3;
  byte bVar4;
  uint uVar5;
  Prs_Man_t *p;
  FILE *__stream;
  long lVar6;
  char *pcVar7;
  Abc_Nam_t *pAVar8;
  Hash_IntMan_t *pHVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  Vec_Ptr_t *pVVar12;
  void **ppvVar13;
  byte *pbVar14;
  ulong uVar15;
  byte *pbVar16;
  Prs_Ntk_t *pPVar17;
  int iVar18;
  byte *pbVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  
  p = (Prs_Man_t *)calloc(1,0x4c0);
  if (pFileName != (char *)0x0) {
    __stream = fopen(pFileName,"rb");
    if (__stream == (FILE *)0x0) {
      puts("Cannot open input file.");
      return (Vec_Ptr_t *)0x0;
    }
    fseek(__stream,0,2);
    lVar6 = ftell(__stream);
    rewind(__stream);
    lVar22 = lVar6 << 0x20;
    pcVar7 = (char *)malloc(lVar22 + 0x1000000000 >> 0x20);
    *pcVar7 = '\n';
    fread(pcVar7 + 1,(long)(int)lVar6,1,__stream);
    fclose(__stream);
    pcVar7[lVar22 + 0x100000000 >> 0x20] = '\n';
    pcVar7[lVar22 + 0x200000000 >> 0x20] = '\0';
    p->pName = pFileName;
    p->pBuffer = pcVar7;
    p->pLimit = pcVar7 + (long)(int)lVar6 + 3;
    p->pCur = pcVar7;
  }
  pAVar8 = Abc_NamStart(1000,0x18);
  p->pStrs = pAVar8;
  pAVar8 = Abc_NamStart(100,0x18);
  p->pFuns = pAVar8;
  pHVar9 = (Hash_IntMan_t *)calloc(1,0x18);
  uVar21 = 1099;
  while( true ) {
    do {
      uVar20 = uVar21;
      uVar21 = uVar20 + 1;
    } while ((uVar20 & 1) != 0);
    if (uVar21 < 9) break;
    iVar18 = 5;
    while (uVar21 % (iVar18 - 2U) != 0) {
      uVar5 = iVar18 * iVar18;
      iVar18 = iVar18 + 2;
      if (uVar21 < uVar5) goto LAB_003e2115;
    }
  }
LAB_003e2115:
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  uVar5 = 0x10;
  if (0xe < uVar20) {
    uVar5 = uVar21;
  }
  pVVar10->nCap = uVar5;
  piVar11 = (int *)malloc((long)(int)uVar5 << 2);
  pVVar10->pArray = piVar11;
  pVVar10->nSize = uVar21;
  if (piVar11 != (int *)0x0) {
    memset(piVar11,0,(long)(int)uVar21 << 2);
  }
  pHVar9->vTable = pVVar10;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 0x1130;
  piVar11 = (int *)malloc(0x44c0);
  pVVar10->pArray = piVar11;
  pHVar9->vObjs = pVVar10;
  piVar11[0] = 0;
  piVar11[1] = 0;
  piVar11[2] = 0;
  piVar11[3] = 0;
  pVVar10->nSize = 4;
  pHVar9->nRefs = 1;
  p->vHash = pHVar9;
  pVVar12 = (Vec_Ptr_t *)malloc(0x10);
  pVVar12->nCap = 100;
  pVVar12->nSize = 0;
  ppvVar13 = (void **)malloc(800);
  pVVar12->pArray = ppvVar13;
  p->vNtks = pVVar12;
  Abc_NamStrFindOrAdd(pAVar8," 0\n",(int *)0x0);
  Abc_NamStrFindOrAdd(p->pFuns," 1\n",(int *)0x0);
  lVar6 = 1;
  do {
    Abc_NamStrFindOrAdd(p->pStrs,s_BlifTypes[lVar6],(int *)0x0);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xb);
  iVar18 = Abc_NamObjNumMax(p->pStrs);
  if (iVar18 != 0xb) {
    __assert_fail("Abc_NamObjNumMax(p->pStrs) == i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadBlif.c"
                  ,0x42,"void Prs_NtkAddBlifDirectives(Prs_Man_t *)");
  }
  if (p->pCur[1] != 0) {
    pVVar10 = &p->vTemp;
    pbVar16 = (byte *)p->pCur;
LAB_003e2254:
    pbVar14 = pbVar16 + 1;
    if (*pbVar16 != 10) {
      __assert_fail("Prs_ManIsChar(p, \'\\n\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadBlif.c"
                    ,0x180,"int Prs_ManReadLines(Prs_Man_t *)");
    }
LAB_003e2260:
    while( true ) {
      p->pCur = (char *)pbVar14;
      bVar4 = *pbVar14;
      uVar15 = (ulong)bVar4;
      if (0x1f < bVar4) break;
      if ((bVar4 != 9) && (bVar4 != 0xd)) {
        if (bVar4 == 10) goto LAB_003e2765;
        goto LAB_003e33a2;
      }
LAB_003e228b:
      pbVar14 = pbVar14 + 1;
    }
    if (0x2d < bVar4) {
      if (bVar4 != 0x5c) {
        if (bVar4 - 0x30 < 2) goto LAB_003e2345;
        if (bVar4 != 0x2e) goto LAB_003e33a2;
        uVar21 = (p->vCover).nSize;
        if (0 < (int)uVar21) {
          if (uVar21 == 2) {
            cVar2 = (p->vCover).pArray[1];
            bVar4 = 4;
            if (cVar2 != '0') {
              if (cVar2 != '1') {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadBlif.c"
                              ,0xe9,"void Prs_ManSaveCover(Prs_Man_t *)");
              }
              bVar4 = 8;
            }
            puVar1 = &p->pNtk->field_0x4;
            *puVar1 = *puVar1 | bVar4;
            uVar21 = (p->vCover).nSize;
            if ((int)uVar21 < 1) {
              __assert_fail("Vec_StrSize(&p->vCover) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadBlif.c"
                            ,0xeb,"void Prs_ManSaveCover(Prs_Man_t *)");
            }
          }
          if (uVar21 == (p->vCover).nCap) {
            if (uVar21 < 0x10) {
              pcVar7 = (p->vCover).pArray;
              if (pcVar7 == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(pcVar7,0x10);
              }
              (p->vCover).pArray = pcVar7;
              (p->vCover).nCap = 0x10;
            }
            else {
              uVar21 = uVar21 * 2;
              pcVar7 = (p->vCover).pArray;
              if (pcVar7 == (char *)0x0) {
                pcVar7 = (char *)malloc((ulong)uVar21);
              }
              else {
                pcVar7 = (char *)realloc(pcVar7,(ulong)uVar21);
              }
              (p->vCover).pArray = pcVar7;
              (p->vCover).nCap = uVar21;
            }
          }
          else {
            pcVar7 = (p->vCover).pArray;
          }
          iVar18 = (p->vCover).nSize;
          (p->vCover).nSize = iVar18 + 1;
          pcVar7[iVar18] = '\0';
          iVar18 = Abc_NamStrFindOrAdd(p->pFuns,(p->vCover).pArray,(int *)0x0);
          (p->vCover).nSize = 0;
          pPVar17 = p->pNtk;
          lVar6 = (long)(pPVar17->vObjs).nSize;
          if (((lVar6 < 1) || (iVar23 = (pPVar17->vObjs).pArray[lVar6 + -1], iVar23 < -1)) ||
             (uVar21 = iVar23 + 1, (pPVar17->vBoxes).nSize <= (int)uVar21)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar11 = (pPVar17->vBoxes).pArray;
          if (piVar11[uVar21] != 1) {
            __assert_fail("Prs_BoxNtk(p->pNtk, Prs_NtkBoxNum(p->pNtk)-1) == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadBlif.c"
                          ,0xf1,"void Prs_ManSaveCover(Prs_Man_t *)");
          }
          piVar11[uVar21] = iVar18;
          pbVar14 = (byte *)p->pCur;
        }
        goto LAB_003e2813;
      }
      pbVar16 = pbVar14 + 1;
      do {
        p->pCur = (char *)pbVar16;
        pbVar14 = pbVar16 + 1;
        bVar4 = *pbVar16;
        pbVar16 = pbVar14;
      } while (bVar4 != 10);
      goto LAB_003e2260;
    }
    if (bVar4 == 0x20) goto LAB_003e228b;
    if (bVar4 != 0x23) {
      if (bVar4 != 0x2d) {
LAB_003e33a2:
        __assert_fail("Prs_ManIsLit(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadBlif.c"
                      ,0xc9,"int Prs_ManReadCube(Prs_Man_t *)");
      }
LAB_003e2345:
      while (((byte)uVar15 < 0x32 && ((0x3200000000000U >> (uVar15 & 0x3f) & 1) != 0))) {
        p->pCur = (char *)(pbVar14 + 1);
        bVar4 = *pbVar14;
        uVar21 = (p->vCover).nSize;
        if (uVar21 == (p->vCover).nCap) {
          if ((int)uVar21 < 0x10) {
            pcVar7 = (p->vCover).pArray;
            if (pcVar7 == (char *)0x0) {
              pcVar7 = (char *)malloc(0x10);
            }
            else {
              pcVar7 = (char *)realloc(pcVar7,0x10);
            }
            (p->vCover).pArray = pcVar7;
            (p->vCover).nCap = 0x10;
          }
          else {
            sVar3 = (ulong)uVar21 * 2;
            pcVar7 = (p->vCover).pArray;
            if (pcVar7 == (char *)0x0) {
              pcVar7 = (char *)malloc(sVar3);
            }
            else {
              pcVar7 = (char *)realloc(pcVar7,sVar3);
            }
            (p->vCover).pArray = pcVar7;
            (p->vCover).nCap = (int)sVar3;
          }
        }
        else {
          pcVar7 = (p->vCover).pArray;
        }
        iVar18 = (p->vCover).nSize;
        (p->vCover).nSize = iVar18 + 1;
        pcVar7[iVar18] = bVar4;
        pbVar14 = (byte *)p->pCur;
        uVar15 = (ulong)*pbVar14;
      }
      do {
        bVar4 = *pbVar14;
        uVar21 = (uint)bVar4;
        if (bVar4 < 0xd) {
          if (bVar4 != 9) goto code_r0x003e2438;
LAB_003e23e6:
          pbVar14 = pbVar14 + 1;
        }
        else {
          if (uVar21 < 0x32) {
            uVar15 = (ulong)uVar21;
            if ((0x100002000U >> (uVar15 & 0x3f) & 1) != 0) goto LAB_003e23e6;
            if ((0x3200000000000U >> (uVar15 & 0x3f) & 1) != 0) {
              uVar21 = (p->vCover).nSize;
              if (uVar21 == (p->vCover).nCap) {
                if ((int)uVar21 < 0x10) {
                  pcVar7 = (p->vCover).pArray;
                  if (pcVar7 == (char *)0x0) {
                    pcVar7 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar7 = (char *)realloc(pcVar7,0x10);
                  }
                  (p->vCover).pArray = pcVar7;
                  (p->vCover).nCap = 0x10;
                }
                else {
                  sVar3 = (ulong)uVar21 * 2;
                  pcVar7 = (p->vCover).pArray;
                  if (pcVar7 == (char *)0x0) {
                    pcVar7 = (char *)malloc(sVar3);
                  }
                  else {
                    pcVar7 = (char *)realloc(pcVar7,sVar3);
                  }
                  (p->vCover).pArray = pcVar7;
                  (p->vCover).nCap = (int)sVar3;
                }
              }
              else {
                pcVar7 = (p->vCover).pArray;
              }
              iVar18 = (p->vCover).nSize;
              (p->vCover).nSize = iVar18 + 1;
              pcVar7[iVar18] = ' ';
              pcVar7 = p->pCur;
              p->pCur = pcVar7 + 1;
              cVar2 = *pcVar7;
              uVar21 = (p->vCover).nSize;
              if (uVar21 == (p->vCover).nCap) {
                if ((int)uVar21 < 0x10) {
                  pcVar7 = (p->vCover).pArray;
                  if (pcVar7 == (char *)0x0) {
                    pcVar7 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar7 = (char *)realloc(pcVar7,0x10);
                  }
                  (p->vCover).pArray = pcVar7;
                  (p->vCover).nCap = 0x10;
                }
                else {
                  sVar3 = (ulong)uVar21 * 2;
                  pcVar7 = (p->vCover).pArray;
                  if (pcVar7 == (char *)0x0) {
                    pcVar7 = (char *)malloc(sVar3);
                  }
                  else {
                    pcVar7 = (char *)realloc(pcVar7,sVar3);
                  }
                  (p->vCover).pArray = pcVar7;
                  (p->vCover).nCap = (int)sVar3;
                }
              }
              else {
                pcVar7 = (p->vCover).pArray;
              }
              iVar18 = (p->vCover).nSize;
              (p->vCover).nSize = iVar18 + 1;
              pcVar7[iVar18] = cVar2;
              uVar21 = (p->vCover).nSize;
              if (uVar21 == (p->vCover).nCap) {
                if ((int)uVar21 < 0x10) {
                  pcVar7 = (p->vCover).pArray;
                  if (pcVar7 == (char *)0x0) {
                    pcVar7 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar7 = (char *)realloc(pcVar7,0x10);
                  }
                  (p->vCover).pArray = pcVar7;
                  (p->vCover).nCap = 0x10;
                }
                else {
                  sVar3 = (ulong)uVar21 * 2;
                  pcVar7 = (p->vCover).pArray;
                  if (pcVar7 == (char *)0x0) {
                    pcVar7 = (char *)malloc(sVar3);
                  }
                  else {
                    pcVar7 = (char *)realloc(pcVar7,sVar3);
                  }
                  (p->vCover).pArray = pcVar7;
                  (p->vCover).nCap = (int)sVar3;
                }
              }
              else {
                pcVar7 = (p->vCover).pArray;
              }
              iVar18 = (p->vCover).nSize;
              (p->vCover).nSize = iVar18 + 1;
              pcVar7[iVar18] = '\n';
              pbVar16 = (byte *)p->pCur;
              goto LAB_003e26c8;
            }
            if (uVar15 == 0x23) goto LAB_003e24a4;
          }
          if (uVar21 != 0x5c) goto LAB_003e2da7;
          pbVar16 = pbVar14 + 1;
          do {
            p->pCur = (char *)pbVar16;
            pbVar14 = pbVar16 + 1;
            bVar4 = *pbVar16;
            pbVar16 = pbVar14;
          } while (bVar4 != 10);
        }
        p->pCur = (char *)pbVar14;
      } while( true );
    }
    do {
      pbVar14 = pbVar14 + 1;
      p->pCur = (char *)pbVar14;
    } while (*pbVar14 != 10);
    goto LAB_003e2765;
  }
  goto LAB_003e2e04;
LAB_003e2813:
  bVar4 = *pbVar14;
  if (bVar4 < 0x20) {
    if ((bVar4 != 9) && (bVar4 != 0xd)) goto LAB_003e2854;
LAB_003e284b:
    pbVar14 = pbVar14 + 1;
  }
  else {
    if (bVar4 == 0x20) goto LAB_003e284b;
    if (bVar4 != 0x5c) {
      if (bVar4 == 0x23) goto LAB_003e2dd9;
      goto LAB_003e2868;
    }
    pbVar16 = pbVar14 + 1;
    do {
      p->pCur = (char *)pbVar16;
      pbVar14 = pbVar16 + 1;
      bVar4 = *pbVar16;
      pbVar16 = pbVar14;
    } while (bVar4 != 10);
  }
  p->pCur = (char *)pbVar14;
  goto LAB_003e2813;
LAB_003e2854:
  if (bVar4 == 10) goto LAB_003e2de6;
LAB_003e2868:
  lVar6 = 0;
  pbVar16 = pbVar14;
  while( true ) {
    pbVar19 = pbVar16 + 1;
    if (((bVar4 < 0x3e) && ((0x2000000900002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) ||
       (bVar4 == 0x5c)) break;
    p->pCur = (char *)pbVar19;
    bVar4 = *pbVar19;
    lVar6 = lVar6 + -1;
    pbVar16 = pbVar19;
  }
  if (lVar6 == 0) goto LAB_003e2de6;
  iVar23 = 0;
  iVar18 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar14,(char *)pbVar16,(int *)0x0);
  switch(iVar18) {
  case 1:
    if (p->pNtk == (Prs_Ntk_t *)0x0) {
      pbVar16 = (byte *)p->pCur;
      do {
        bVar4 = *pbVar16;
        if (bVar4 < 0x20) {
          if ((bVar4 != 9) && (bVar4 != 0xd)) goto LAB_003e2b9c;
LAB_003e291c:
          pbVar16 = pbVar16 + 1;
        }
        else {
          if (bVar4 == 0x20) goto LAB_003e291c;
          if (bVar4 != 0x5c) {
            if (bVar4 == 0x23) goto LAB_003e3074;
            goto LAB_003e2bb0;
          }
          pbVar14 = pbVar16 + 1;
          do {
            p->pCur = (char *)pbVar14;
            pbVar16 = pbVar14 + 1;
            bVar4 = *pbVar14;
            pbVar14 = pbVar16;
          } while (bVar4 != 10);
        }
        p->pCur = (char *)pbVar16;
      } while( true );
    }
    if (p->ErrorStr[0] != '\0') goto LAB_003e341e;
    builtin_strncpy(p->ErrorStr,"Parsing previous model is unfinished.",0x26);
    goto LAB_003e2e04;
  case 2:
    iVar18 = Prs_ManReadList(p,&p->pNtk->vOrder,3);
    if (iVar18 != 0) goto LAB_003e2e04;
    if (0 < (p->vTemp).nSize) {
      pPVar17 = p->pNtk;
      lVar6 = 0;
      do {
        Vec_IntPush(&pPVar17->vInouts,(p->vTemp).pArray[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 < (p->vTemp).nSize);
    }
    break;
  case 3:
    iVar18 = Prs_ManReadList(p,&p->pNtk->vOrder,1);
    if (iVar18 != 0) goto LAB_003e2e04;
    if (0 < (p->vTemp).nSize) {
      pPVar17 = p->pNtk;
      lVar6 = 0;
      do {
        Vec_IntPush(&pPVar17->vInputs,(p->vTemp).pArray[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 < (p->vTemp).nSize);
    }
    break;
  case 4:
    iVar18 = Prs_ManReadList(p,&p->pNtk->vOrder,2);
    if (iVar18 != 0) goto LAB_003e2e04;
    if (0 < (p->vTemp).nSize) {
      pPVar17 = p->pNtk;
      lVar6 = 0;
      do {
        Vec_IntPush(&pPVar17->vOutputs,(p->vTemp).pArray[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 < (p->vTemp).nSize);
    }
    break;
  case 5:
    (p->vTemp).nSize = 0;
LAB_003e292c:
    pbVar16 = (byte *)p->pCur;
    do {
      bVar4 = *pbVar16;
      if (bVar4 < 0x20) {
        if ((bVar4 != 9) && (bVar4 != 0xd)) goto LAB_003e2971;
LAB_003e2968:
        pbVar16 = pbVar16 + 1;
      }
      else {
        if (bVar4 == 0x20) goto LAB_003e2968;
        if (bVar4 != 0x5c) {
          if (bVar4 == 0x23) goto LAB_003e2b6b;
          goto LAB_003e2985;
        }
        pbVar14 = pbVar16 + 1;
        do {
          p->pCur = (char *)pbVar14;
          pbVar16 = pbVar14 + 1;
          bVar4 = *pbVar14;
          pbVar14 = pbVar16;
        } while (bVar4 != 10);
      }
      p->pCur = (char *)pbVar16;
    } while( true );
  case 7:
    iVar23 = 1;
  case 6:
    iVar18 = Prs_ManReadBox(p,iVar23);
    if (iVar18 != 0) goto LAB_003e2e04;
    break;
  case 8:
    pbVar16 = (byte *)p->pCur;
    goto LAB_003e30f0;
  case 9:
    pbVar16 = (byte *)p->pCur;
    goto LAB_003e313c;
  case 10:
    if (p->pNtk != (Prs_Ntk_t *)0x0) {
      p->pNtk = (Prs_Ntk_t *)0x0;
      pbVar16 = (byte *)p->pCur;
      do {
        bVar4 = *pbVar16;
        if (bVar4 < 0x20) {
          if ((bVar4 != 9) && (bVar4 != 0xd)) goto LAB_003e2be0;
LAB_003e2b5f:
          pbVar16 = pbVar16 + 1;
        }
        else {
          if (bVar4 == 0x20) goto LAB_003e2b5f;
          if (bVar4 != 0x5c) {
            if (bVar4 == 0x23) goto LAB_003e2bfa;
            goto LAB_003e3042;
          }
          pbVar14 = pbVar16 + 1;
          do {
            p->pCur = (char *)pbVar14;
            pbVar16 = pbVar14 + 1;
            bVar4 = *pbVar14;
            pbVar14 = pbVar16;
          } while (bVar4 != 10);
        }
        p->pCur = (char *)pbVar16;
      } while( true );
    }
    if (p->ErrorStr[0] != '\0') goto LAB_003e341e;
    builtin_strncpy(p->ErrorStr + 0xf,"without .model.",0x10);
    uVar24._0_1_ = 'D';
    uVar24._1_1_ = 'i';
    uVar24._2_1_ = 'r';
    uVar24._3_1_ = 'e';
    uVar25._0_1_ = 'c';
    uVar25._1_1_ = 't';
    uVar25._2_1_ = 'i';
    uVar25._3_1_ = 'v';
    uVar26._0_1_ = 'e';
    uVar26._1_1_ = ' ';
    uVar26._2_1_ = '.';
    uVar26._3_1_ = 'e';
    uVar27._0_1_ = 'n';
    uVar27._1_1_ = 'd';
    uVar27._2_1_ = ' ';
    uVar27._3_1_ = 'w';
    goto LAB_003e2dd1;
  default:
    goto switchD_003e28cc_default;
  }
LAB_003e2761:
  pbVar14 = (byte *)p->pCur;
LAB_003e2765:
  pbVar16 = pbVar14;
  if (pbVar14[1] == 0) goto LAB_003e2e04;
  goto LAB_003e2254;
LAB_003e2bfa:
  do {
    pbVar16 = pbVar16 + 1;
    p->pCur = (char *)pbVar16;
  } while (*pbVar16 != 10);
  goto LAB_003e2761;
LAB_003e2be0:
  if (bVar4 != 10) {
LAB_003e3042:
    if (p->ErrorStr[0] != '\0') goto LAB_003e341e;
    builtin_strncpy(p->ErrorStr + 0xf,"s on .end line.",0x10);
    uVar24._0_1_ = 'T';
    uVar24._1_1_ = 'r';
    uVar24._2_1_ = 'a';
    uVar24._3_1_ = 'i';
    uVar25._0_1_ = 'l';
    uVar25._1_1_ = 'i';
    uVar25._2_1_ = 'n';
    uVar25._3_1_ = 'g';
    uVar26._0_1_ = ' ';
    uVar26._1_1_ = 's';
    uVar26._2_1_ = 'y';
    uVar26._3_1_ = 'm';
    uVar27._0_1_ = 'b';
    uVar27._1_1_ = 'o';
    uVar27._2_1_ = 'l';
    uVar27._3_1_ = 's';
    goto LAB_003e2dd1;
  }
  goto LAB_003e2761;
LAB_003e313c:
  bVar4 = *pbVar16;
  if (bVar4 < 0x20) {
    if ((bVar4 != 9) && (bVar4 != 0xd)) goto LAB_003e324a;
LAB_003e317b:
    pbVar16 = pbVar16 + 1;
  }
  else {
    if (bVar4 == 0x20) goto LAB_003e317b;
    if (bVar4 != 0x5c) {
      if (bVar4 == 0x23) goto LAB_003e3264;
      goto LAB_003e32ff;
    }
    pbVar14 = pbVar16 + 1;
    do {
      p->pCur = (char *)pbVar14;
      pbVar16 = pbVar14 + 1;
      bVar4 = *pbVar14;
      pbVar14 = pbVar16;
    } while (bVar4 != 10);
  }
  p->pCur = (char *)pbVar16;
  goto LAB_003e313c;
LAB_003e324a:
  if (bVar4 == 10) goto LAB_003e336c;
LAB_003e32ff:
  lVar6 = 0;
  pbVar14 = pbVar16;
  while( true ) {
    pbVar19 = pbVar14 + 1;
    if (((bVar4 < 0x3e) && ((0x2000000900002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) ||
       (bVar4 == 0x5c)) break;
    p->pCur = (char *)pbVar19;
    bVar4 = *pbVar19;
    lVar6 = lVar6 + -1;
    pbVar14 = pbVar19;
  }
  if (lVar6 == 0) goto LAB_003e336c;
  iVar18 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar16,(char *)pbVar14,(int *)0x0);
  (p->vTemp).nSize = 0;
  if (iVar18 != 0) goto LAB_003e334d;
  goto LAB_003e3373;
LAB_003e3264:
  do {
    pbVar16 = pbVar16 + 1;
    p->pCur = (char *)pbVar16;
  } while (*pbVar16 != 10);
LAB_003e336c:
  (p->vTemp).nSize = 0;
LAB_003e3373:
  if (p->ErrorStr[0] != '\0') goto LAB_003e341e;
  builtin_strncpy(p->ErrorStr + 10,"d .short input.",0x10);
  uVar24._0_1_ = 'C';
  uVar24._1_1_ = 'a';
  uVar24._2_1_ = 'n';
  uVar24._3_1_ = 'n';
  uVar25._0_1_ = 'o';
  uVar25._1_1_ = 't';
  uVar25._2_1_ = ' ';
  uVar25._3_1_ = 'r';
  uVar26._0_1_ = 'e';
  uVar26._1_1_ = 'a';
  uVar26._2_1_ = 'd';
  uVar26._3_1_ = ' ';
  uVar27._0_1_ = '.';
  uVar27._1_1_ = 's';
  uVar27._2_1_ = 'h';
  uVar27._3_1_ = 'o';
  goto LAB_003e2dd1;
LAB_003e30f0:
  bVar4 = *pbVar16;
  if (bVar4 < 0x20) {
    if ((bVar4 != 9) && (bVar4 != 0xd)) goto LAB_003e3228;
LAB_003e312f:
    pbVar16 = pbVar16 + 1;
  }
  else {
    if (bVar4 == 0x20) goto LAB_003e312f;
    if (bVar4 != 0x5c) {
      if (bVar4 == 0x23) goto LAB_003e323b;
      goto LAB_003e3276;
    }
    pbVar14 = pbVar16 + 1;
    do {
      p->pCur = (char *)pbVar14;
      pbVar16 = pbVar14 + 1;
      bVar4 = *pbVar14;
      pbVar14 = pbVar16;
    } while (bVar4 != 10);
  }
  p->pCur = (char *)pbVar16;
  goto LAB_003e30f0;
LAB_003e3228:
  if (bVar4 == 10) goto LAB_003e32c9;
LAB_003e3276:
  lVar6 = 0;
  pbVar14 = pbVar16;
  while( true ) {
    pbVar19 = pbVar14 + 1;
    if (((bVar4 < 0x3e) && ((0x2000000900002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) ||
       (bVar4 == 0x5c)) break;
    p->pCur = (char *)pbVar19;
    bVar4 = *pbVar19;
    lVar6 = lVar6 + -1;
    pbVar14 = pbVar19;
  }
  if (lVar6 == 0) goto LAB_003e32c9;
  iVar18 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar16,(char *)pbVar14,(int *)0x0);
  (p->vTemp).nSize = 0;
  if (iVar18 != 0) {
LAB_003e334d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  goto LAB_003e32d0;
LAB_003e2971:
  if (bVar4 == 10) goto LAB_003e2b78;
LAB_003e2985:
  lVar6 = 0;
  pbVar14 = pbVar16;
  while( true ) {
    pbVar19 = pbVar14 + 1;
    if (((bVar4 < 0x3e) && ((0x2000000900002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) ||
       (bVar4 == 0x5c)) break;
    p->pCur = (char *)pbVar19;
    bVar4 = *pbVar19;
    lVar6 = lVar6 + -1;
    pbVar14 = pbVar19;
  }
  if ((lVar6 == 0) ||
     (iVar18 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar16,(char *)pbVar14,(int *)0x0),
     iVar18 == 0)) goto LAB_003e2b78;
  Vec_IntPush(pVVar10,0);
  Vec_IntPush(pVVar10,iVar18);
  goto LAB_003e292c;
LAB_003e2b6b:
  do {
    pbVar16 = pbVar16 + 1;
    p->pCur = (char *)pbVar16;
  } while (*pbVar16 != 10);
LAB_003e2b78:
  if ((p->vTemp).nSize == 0) {
    if (p->ErrorStr[0] != '\0') goto LAB_003e341e;
    builtin_strncpy(p->ErrorStr,"Signal list is empty.",0x16);
    goto LAB_003e2e04;
  }
  Prs_NtkAddBox(p->pNtk,1,0,pVVar10);
  goto LAB_003e2761;
LAB_003e2b9c:
  if (bVar4 != 10) {
LAB_003e2bb0:
    lVar6 = 0;
    pbVar14 = pbVar16;
    while( true ) {
      pbVar19 = pbVar14 + 1;
      if (((bVar4 < 0x3e) && ((0x2000000900002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) ||
         (bVar4 == 0x5c)) break;
      p->pCur = (char *)pbVar19;
      bVar4 = *pbVar19;
      lVar6 = lVar6 + -1;
      pbVar14 = pbVar19;
    }
    if ((lVar6 != 0) &&
       (iVar18 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar16,(char *)pbVar14,(int *)0x0),
       iVar18 != 0)) {
      if (p->pNtk != (Prs_Ntk_t *)0x0) {
        __assert_fail("p->pNtk == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaPrs.h"
                      ,0xd7,"void Prs_ManInitializeNtk(Prs_Man_t *, int, int)");
      }
      pPVar17 = (Prs_Ntk_t *)calloc(1,0xf0);
      p->pNtk = pPVar17;
      pPVar17->iModuleName = iVar18;
      pAVar8 = Abc_NamRef(p->pStrs);
      p->pNtk->pStrs = pAVar8;
      pAVar8 = Abc_NamRef(p->pFuns);
      pPVar17 = p->pNtk;
      pPVar17->pFuns = pAVar8;
      pHVar9 = p->vHash;
      piVar11 = &pHVar9->nRefs;
      *piVar11 = *piVar11 + 1;
      pPVar17->vHash = pHVar9;
      pVVar12 = p->vNtks;
      uVar21 = pVVar12->nSize;
      if (uVar21 == pVVar12->nCap) {
        if ((int)uVar21 < 0x10) {
          if (pVVar12->pArray == (void **)0x0) {
            ppvVar13 = (void **)malloc(0x80);
          }
          else {
            ppvVar13 = (void **)realloc(pVVar12->pArray,0x80);
          }
          pVVar12->pArray = ppvVar13;
          pVVar12->nCap = 0x10;
        }
        else {
          if (pVVar12->pArray == (void **)0x0) {
            ppvVar13 = (void **)malloc((ulong)uVar21 << 4);
          }
          else {
            ppvVar13 = (void **)realloc(pVVar12->pArray,(ulong)uVar21 << 4);
          }
          pVVar12->pArray = ppvVar13;
          pVVar12->nCap = uVar21 * 2;
        }
      }
      else {
        ppvVar13 = pVVar12->pArray;
      }
      iVar18 = pVVar12->nSize;
      pVVar12->nSize = iVar18 + 1;
      ppvVar13[iVar18] = pPVar17;
      pbVar16 = (byte *)p->pCur;
      do {
        bVar4 = *pbVar16;
        if (bVar4 < 0x20) {
          if ((bVar4 != 9) && (bVar4 != 0xd)) goto LAB_003e2d3b;
LAB_003e2d32:
          pbVar16 = pbVar16 + 1;
        }
        else {
          if (bVar4 == 0x20) goto LAB_003e2d32;
          if (bVar4 != 0x5c) {
            if (bVar4 == 0x23) goto LAB_003e2d55;
            goto LAB_003e30b6;
          }
          pbVar14 = pbVar16 + 1;
          do {
            p->pCur = (char *)pbVar14;
            pbVar16 = pbVar14 + 1;
            bVar4 = *pbVar14;
            pbVar14 = pbVar16;
          } while (bVar4 != 10);
        }
        p->pCur = (char *)pbVar16;
      } while( true );
    }
  }
  goto LAB_003e3081;
LAB_003e2d55:
  do {
    pbVar16 = pbVar16 + 1;
    p->pCur = (char *)pbVar16;
  } while (*pbVar16 != 10);
  goto LAB_003e2761;
LAB_003e2d3b:
  if (bVar4 != 10) {
LAB_003e30b6:
    if (p->ErrorStr[0] != '\0') goto LAB_003e341e;
    builtin_strncpy(p->ErrorStr,"Trailing symbols on .model line.",0x21);
    goto LAB_003e2e04;
  }
  goto LAB_003e2761;
LAB_003e3074:
  do {
    pbVar16 = pbVar16 + 1;
    p->pCur = (char *)pbVar16;
  } while (*pbVar16 != 10);
LAB_003e3081:
  if (p->ErrorStr[0] == '\0') {
    builtin_strncpy(p->ErrorStr,"Cannot read model name.",0x18);
    goto LAB_003e2e04;
  }
  goto LAB_003e341e;
LAB_003e2dd9:
  do {
    pbVar14 = pbVar14 + 1;
    p->pCur = (char *)pbVar14;
  } while (*pbVar14 != 10);
LAB_003e2de6:
  iVar18 = 0;
switchD_003e28cc_default:
  pcVar7 = Abc_NamStr(p->pStrs,iVar18);
  printf("Cannot read directive \"%s\".\n",pcVar7);
  goto LAB_003e2e04;
LAB_003e26c8:
  bVar4 = *pbVar16;
  if (bVar4 < 0x20) {
    if ((bVar4 != 9) && (bVar4 != 0xd)) goto LAB_003e2707;
LAB_003e26fe:
    pbVar16 = pbVar16 + 1;
  }
  else {
    if (bVar4 == 0x20) goto LAB_003e26fe;
    if (bVar4 != 0x5c) {
      if (bVar4 == 0x23) goto LAB_003e271d;
      goto LAB_003e2d7b;
    }
    pbVar14 = pbVar16 + 1;
    do {
      p->pCur = (char *)pbVar14;
      pbVar16 = pbVar14 + 1;
      bVar4 = *pbVar14;
      pbVar14 = pbVar16;
    } while (bVar4 != 10);
  }
  p->pCur = (char *)pbVar16;
  goto LAB_003e26c8;
LAB_003e271d:
  do {
    pbVar16 = pbVar16 + 1;
    p->pCur = (char *)pbVar16;
  } while (*pbVar16 != 10);
  goto LAB_003e2761;
LAB_003e2707:
  if (bVar4 != 10) {
LAB_003e2d7b:
    if (p->ErrorStr[0] != '\0') goto LAB_003e341e;
    builtin_strncpy(p->ErrorStr + 9,"ad end of cube.",0x10);
    uVar24._0_1_ = 'C';
    uVar24._1_1_ = 'a';
    uVar24._2_1_ = 'n';
    uVar24._3_1_ = 'n';
    uVar25._0_1_ = 'o';
    uVar25._1_1_ = 't';
    uVar25._2_1_ = ' ';
    uVar25._3_1_ = 'r';
    uVar26._0_1_ = 'e';
    uVar26._1_1_ = 'a';
    uVar26._2_1_ = 'd';
    uVar26._3_1_ = ' ';
    uVar27._0_1_ = 'e';
    uVar27._1_1_ = 'n';
    uVar27._2_1_ = 'd';
    uVar27._3_1_ = ' ';
    goto LAB_003e2dd1;
  }
  goto LAB_003e2761;
LAB_003e24a4:
  do {
    pbVar14 = pbVar14 + 1;
    p->pCur = (char *)pbVar14;
  } while (*pbVar14 != 10);
  goto LAB_003e24b1;
code_r0x003e2438:
  if (uVar21 != 10) {
LAB_003e2da7:
    if (p->ErrorStr[0] != '\0') goto LAB_003e341e;
    builtin_strncpy(p->ErrorStr + 0xc,"output literal.",0x10);
    uVar24._0_1_ = 'C';
    uVar24._1_1_ = 'a';
    uVar24._2_1_ = 'n';
    uVar24._3_1_ = 'n';
    uVar25._0_1_ = 'o';
    uVar25._1_1_ = 't';
    uVar25._2_1_ = ' ';
    uVar25._3_1_ = 'r';
    uVar26._0_1_ = 'e';
    uVar26._1_1_ = 'a';
    uVar26._2_1_ = 'd';
    uVar26._3_1_ = ' ';
    uVar27._0_1_ = 'o';
    uVar27._1_1_ = 'u';
    uVar27._2_1_ = 't';
    uVar27._3_1_ = 'p';
    goto LAB_003e2dd1;
  }
LAB_003e24b1:
  if ((p->vCover).nSize != 1) {
    if (p->ErrorStr[0] != '\0') goto LAB_003e341e;
    builtin_strncpy(p->ErrorStr,"Cannot read cube.",0x12);
    goto LAB_003e2e04;
  }
  pcVar7 = (p->vCover).pArray;
  cVar2 = *pcVar7;
  iVar18 = 1;
  if ((p->vCover).nCap == 1) {
    pcVar7 = (char *)realloc(pcVar7,0x10);
    (p->vCover).pArray = pcVar7;
    (p->vCover).nCap = 0x10;
    iVar18 = (p->vCover).nSize;
  }
  (p->vCover).nSize = iVar18 + 1;
  pcVar7[iVar18] = cVar2;
  if ((p->vCover).nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                  ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
  }
  *(p->vCover).pArray = ' ';
  uVar21 = (p->vCover).nSize;
  if (uVar21 == (p->vCover).nCap) {
    if ((int)uVar21 < 0x10) {
      pcVar7 = (p->vCover).pArray;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(pcVar7,0x10);
      }
      (p->vCover).pArray = pcVar7;
      (p->vCover).nCap = 0x10;
    }
    else {
      sVar3 = (ulong)uVar21 * 2;
      pcVar7 = (p->vCover).pArray;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar3);
      }
      else {
        pcVar7 = (char *)realloc(pcVar7,sVar3);
      }
      (p->vCover).pArray = pcVar7;
      (p->vCover).nCap = (int)sVar3;
    }
  }
  else {
    pcVar7 = (p->vCover).pArray;
  }
  iVar18 = (p->vCover).nSize;
  (p->vCover).nSize = iVar18 + 1;
  pcVar7[iVar18] = '\n';
  goto LAB_003e2761;
LAB_003e323b:
  do {
    pbVar16 = pbVar16 + 1;
    p->pCur = (char *)pbVar16;
  } while (*pbVar16 != 10);
LAB_003e32c9:
  (p->vTemp).nSize = 0;
LAB_003e32d0:
  if (p->ErrorStr[0] != '\0') {
LAB_003e341e:
    __assert_fail("!p->ErrorStr[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaPrs.h"
                  ,0xc0,"int Prs_ManErrorSet(Prs_Man_t *, char *, int)");
  }
  builtin_strncpy(p->ErrorStr + 9,"ad latch input.",0x10);
  uVar24._0_1_ = 'C';
  uVar24._1_1_ = 'a';
  uVar24._2_1_ = 'n';
  uVar24._3_1_ = 'n';
  uVar25._0_1_ = 'o';
  uVar25._1_1_ = 't';
  uVar25._2_1_ = ' ';
  uVar25._3_1_ = 'r';
  uVar26._0_1_ = 'e';
  uVar26._1_1_ = 'a';
  uVar26._2_1_ = 'd';
  uVar26._3_1_ = ' ';
  uVar27._0_1_ = 'l';
  uVar27._1_1_ = 'a';
  uVar27._2_1_ = 't';
  uVar27._3_1_ = 'c';
LAB_003e2dd1:
  *(undefined4 *)p->ErrorStr = uVar24;
  *(undefined4 *)(p->ErrorStr + 4) = uVar25;
  *(undefined4 *)(p->ErrorStr + 8) = uVar26;
  *(undefined4 *)(p->ErrorStr + 0xc) = uVar27;
LAB_003e2e04:
  if (p->ErrorStr[0] == '\0') {
    pVVar12 = p->vNtks;
    p->vNtks = (Vec_Ptr_t *)0x0;
  }
  else {
    pcVar7 = p->pBuffer;
    uVar15 = 0;
    if (pcVar7 < p->pCur) {
      uVar15 = 0;
      do {
        uVar15 = (ulong)((int)uVar15 + (uint)(*pcVar7 == '\n'));
        pcVar7 = pcVar7 + 1;
      } while (pcVar7 != p->pCur);
    }
    pVVar12 = (Vec_Ptr_t *)0x0;
    printf("Line %d: %s\n",uVar15,p->ErrorStr);
  }
  if (p->pStrs != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p->pStrs);
  }
  if (p->pFuns != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p->pFuns);
  }
  pHVar9 = p->vHash;
  if (pHVar9 != (Hash_IntMan_t *)0x0) {
    piVar11 = &pHVar9->nRefs;
    *piVar11 = *piVar11 + -1;
    if (*piVar11 == 0) {
      pVVar10 = pHVar9->vObjs;
      piVar11 = pVVar10->pArray;
      if (piVar11 != (int *)0x0) {
        free(piVar11);
      }
      free(pVVar10);
      pVVar10 = pHVar9->vTable;
      piVar11 = pVVar10->pArray;
      if (piVar11 != (int *)0x0) {
        free(piVar11);
      }
      free(pVVar10);
      free(pHVar9);
    }
  }
  if (p->vNtks != (Vec_Ptr_t *)0x0) {
    Prs_ManVecFree(p->vNtks);
  }
  pcVar7 = (p->vCover).pArray;
  if (pcVar7 != (char *)0x0) {
    free(pcVar7);
    (p->vCover).pArray = (char *)0x0;
  }
  (p->vCover).nCap = 0;
  (p->vCover).nSize = 0;
  piVar11 = (p->vTemp).pArray;
  if (piVar11 != (int *)0x0) {
    free(piVar11);
    (p->vTemp).pArray = (int *)0x0;
  }
  (p->vTemp).nCap = 0;
  (p->vTemp).nSize = 0;
  piVar11 = (p->vTemp2).pArray;
  if (piVar11 != (int *)0x0) {
    free(piVar11);
    (p->vTemp2).pArray = (int *)0x0;
  }
  (p->vTemp2).nCap = 0;
  (p->vTemp2).nSize = 0;
  piVar11 = (p->vTemp3).pArray;
  if (piVar11 != (int *)0x0) {
    free(piVar11);
    (p->vTemp3).pArray = (int *)0x0;
  }
  (p->vTemp3).nCap = 0;
  (p->vTemp3).nSize = 0;
  piVar11 = (p->vTemp4).pArray;
  if (piVar11 != (int *)0x0) {
    free(piVar11);
    (p->vTemp4).pArray = (int *)0x0;
  }
  (p->vTemp4).nCap = 0;
  (p->vTemp4).nSize = 0;
  piVar11 = (p->vKnown).pArray;
  if (piVar11 != (int *)0x0) {
    free(piVar11);
    (p->vKnown).pArray = (int *)0x0;
  }
  (p->vKnown).nCap = 0;
  (p->vKnown).nSize = 0;
  piVar11 = (p->vFailed).pArray;
  if (piVar11 != (int *)0x0) {
    free(piVar11);
    (p->vFailed).pArray = (int *)0x0;
  }
  (p->vFailed).nCap = 0;
  (p->vFailed).nSize = 0;
  piVar11 = (p->vSucceeded).pArray;
  if (piVar11 != (int *)0x0) {
    free(piVar11);
    (p->vSucceeded).pArray = (int *)0x0;
  }
  (p->vSucceeded).nCap = 0;
  (p->vSucceeded).nSize = 0;
  if (p->pBuffer != (char *)0x0) {
    free(p->pBuffer);
  }
  free(p);
  return pVVar12;
}

Assistant:

Vec_Ptr_t * Prs_ManReadBlif( char * pFileName )
{
    Vec_Ptr_t * vPrs = NULL;
    Prs_Man_t * p = Prs_ManAlloc( pFileName );
    if ( p == NULL )
        return NULL;
    Abc_NamStrFindOrAdd( p->pFuns, " 0\n", NULL );
    Abc_NamStrFindOrAdd( p->pFuns, " 1\n", NULL );
    Prs_NtkAddBlifDirectives( p );
    Prs_ManReadLines( p );
    if ( Prs_ManErrorPrint(p) )
        ABC_SWAP( Vec_Ptr_t *, vPrs, p->vNtks );
    Prs_ManFree( p );
    return vPrs;
}